

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O3

bool __thiscall llvm::FoldingSetBase::RemoveNode(FoldingSetBase *this,Node *N)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar1 = (Node *)N->NextInFoldingSetBucket;
  if (pNVar1 != (Node *)0x0) {
    this->NumNodes = this->NumNodes - 1;
    N->NextInFoldingSetBucket = (void *)0x0;
    pNVar2 = pNVar1;
    do {
      pNVar3 = pNVar2;
      if (pNVar3 == (Node *)0x0 || ((ulong)pNVar3 & 1) != 0) {
        if (((ulong)pNVar3 & 1) == 0) {
          __assert_fail("(Ptr & 1) && \"Not a bucket pointer\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                        ,0xcb,"void **GetBucketPtr(void *)");
        }
        pNVar3 = (Node *)((ulong)pNVar3 & 0xfffffffffffffffe);
      }
      pNVar2 = (Node *)pNVar3->NextInFoldingSetBucket;
    } while ((Node *)pNVar3->NextInFoldingSetBucket != N);
    pNVar3->NextInFoldingSetBucket = pNVar1;
  }
  return pNVar1 != (Node *)0x0;
}

Assistant:

bool FoldingSetBase::RemoveNode(Node *N) {
  // Because each bucket is a circular list, we don't need to compute N's hash
  // to remove it.
  void *Ptr = N->getNextInBucket();
  if (!Ptr) return false;  // Not in folding set.

  --NumNodes;
  N->SetNextInBucket(nullptr);

  // Remember what N originally pointed to, either a bucket or another node.
  void *NodeNextPtr = Ptr;

  // Chase around the list until we find the node (or bucket) which points to N.
  while (true) {
    if (Node *NodeInBucket = GetNextPtr(Ptr)) {
      // Advance pointer.
      Ptr = NodeInBucket->getNextInBucket();

      // We found a node that points to N, change it to point to N's next node,
      // removing N from the list.
      if (Ptr == N) {
        NodeInBucket->SetNextInBucket(NodeNextPtr);
        return true;
      }
    } else {
      void **Bucket = GetBucketPtr(Ptr);
      Ptr = *Bucket;

      // If we found that the bucket points to N, update the bucket to point to
      // whatever is next.
      if (Ptr == N) {
        *Bucket = NodeNextPtr;
        return true;
      }
    }
  }
}